

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDFace::RemoveEdgeFromArray(ON_SubDFace *this,ON_SubDEdge *e)

{
  uint uVar1;
  uint local_24;
  uint i;
  ON_SubDEdge *e_local;
  ON_SubDFace *this_local;
  
  if (e != (ON_SubDEdge *)0x0) {
    if (this->m_edge_count < 5) {
      for (local_24 = 0; local_24 < this->m_edge_count; local_24 = local_24 + 1) {
        uVar1 = local_24;
        if (e == (ON_SubDEdge *)(this->m_edge4[local_24].m_ptr & 0xfffffffffffffff8)) {
          while (local_24 = uVar1 + 1, local_24 < this->m_edge_count) {
            this->m_edge4[uVar1].m_ptr = this->m_edge4[local_24].m_ptr;
            uVar1 = local_24;
          }
          this->m_edge_count = this->m_edge_count - 1;
          this->m_edge4[this->m_edge_count].m_ptr = 0;
          return true;
        }
      }
    }
    else {
      for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
        uVar1 = local_24;
        if (e == (ON_SubDEdge *)(this->m_edge4[local_24].m_ptr & 0xfffffffffffffff8)) {
          while (local_24 = uVar1 + 1, local_24 < 4) {
            this->m_edge4[uVar1].m_ptr = this->m_edge4[local_24].m_ptr;
            uVar1 = local_24;
          }
          this->m_edge4[3].m_ptr = this->m_edgex->m_ptr;
          for (local_24 = 5; local_24 < this->m_edge_count; local_24 = local_24 + 1) {
            this->m_edgex[local_24 - 5].m_ptr = this->m_edgex[local_24 - 4].m_ptr;
          }
          this->m_edge_count = this->m_edge_count - 1;
          this->m_edgex[(int)(this->m_edge_count - 4)].m_ptr = 0;
          return true;
        }
      }
      for (local_24 = 4; local_24 < this->m_edge_count; local_24 = local_24 + 1) {
        uVar1 = local_24;
        if (e == (ON_SubDEdge *)(this->m_edgex[local_24 - 4].m_ptr & 0xfffffffffffffff8)) {
          while (local_24 = uVar1 + 1, local_24 < this->m_edge_count) {
            this->m_edgex[uVar1 - 4].m_ptr = this->m_edgex[uVar1 - 3].m_ptr;
            uVar1 = local_24;
          }
          this->m_edge_count = this->m_edge_count - 1;
          this->m_edgex[(int)(this->m_edge_count - 4)].m_ptr = 0;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_SubDFace::RemoveEdgeFromArray(
  const ON_SubDEdge* e
  )
{
  unsigned int i;
  if (nullptr == e)
    return false;

  if (m_edge_count <= 4)
  {
    for (i = 0; i < m_edge_count; i++)
    {
      if (e == ON_SUBD_EDGE_POINTER(m_edge4[i].m_ptr))
      {
        for (i++; i < m_edge_count; i++)
          m_edge4[i - 1] = m_edge4[i];
        m_edge_count--;
        m_edge4[m_edge_count] = ON_SubDEdgePtr::Null;
        return true;
      }
    }
  }
  else
  {
    for (i = 0; i < 4; i++)
    {
      if (e == ON_SUBD_EDGE_POINTER(m_edge4[i].m_ptr))
      {
        for (i++; i < 4; i++)
          m_edge4[i - 1] = m_edge4[i];
        m_edge4[3] = m_edgex[0];
        for (i = 5; i < m_edge_count; i++)
          m_edgex[i - 5] = m_edgex[i - 4];
        m_edge_count--;
        m_edgex[m_edge_count-4] = ON_SubDEdgePtr::Null;
        return true;
      }
    }
    for (i = 4; i < m_edge_count; i++)
    {
      if (e == ON_SUBD_EDGE_POINTER(m_edgex[i - 4].m_ptr))
      {
        for (i++; i < m_edge_count; i++)
          m_edgex[i - 5] = m_edgex[i - 4];
        m_edge_count--;
        m_edgex[m_edge_count-4] = ON_SubDEdgePtr::Null;
        return true;
      }
    }
  }

  return false;
}